

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O2

LY_ERR lydxml_subtree_r(lyd_xml_ctx *lydctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  byte *pbVar1;
  ushort uVar2;
  lyxml_ctx *plVar3;
  ly_ctx *ctx;
  lysc_ext_instance *plVar4;
  lysc_ext *plVar5;
  lyd_meta *plVar6;
  size_t __n;
  long lVar7;
  ly_set *set;
  LY_ERR LVar8;
  int iVar9;
  LY_ERR LVar10;
  LYXML_PARSER_STATUS LVar11;
  uint uVar12;
  lyxml_ns *plVar13;
  lys_module *plVar14;
  lysc_node *plVar15;
  void *pvVar16;
  uint32_t *opts;
  ly_err_item *plVar17;
  lyd_node *plVar18;
  lyd_node *plVar19;
  longlong lVar20;
  char *pcVar21;
  size_t sVar22;
  lyd_node **pplVar23;
  lysc_node *last;
  char *pcVar24;
  undefined8 uVar25;
  LY_ERR LVar26;
  LY_ERR LVar27;
  ulong uVar28;
  ly_ctx *plVar29;
  lyd_meta *plVar30;
  uint uVar31;
  void *pvVar32;
  lysc_node **pplVar33;
  char cVar34;
  lysc_ext_instance *plVar35;
  uint32_t uVar36;
  bool bVar37;
  lyd_meta *plVar38;
  lyd_node *in_stack_fffffffffffffe68;
  lyd_node *node;
  lyd_ctx *local_150;
  undefined8 local_148;
  char *local_140;
  char *local_138;
  ly_ctx *local_130;
  ly_bool local_121;
  lysc_node *snode;
  lysc_node *local_118;
  lyd_node_inner *local_110;
  LYXML_PARSER_STATUS next;
  lyd_meta *meta;
  lyd_meta *local_f8;
  lysc_ext_instance *ext;
  void *val_prefix_data;
  anon_union_8_3_0df1e6ad_for_ly_set_2 aStack_e0;
  lysc_node *local_d8;
  lyxml_ctx *local_d0;
  lyd_node **local_c8;
  lyd_attr *attr;
  lyd_node *local_b8;
  uint local_b0;
  uint32_t local_ac;
  size_t local_a8;
  ly_set *local_a0;
  lyxml_ctx pxmlctx;
  
  meta = (lyd_meta *)0x0;
  attr = (lyd_attr *)0x0;
  snode = (lysc_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  node = (lyd_node *)0x0;
  local_118 = (lysc_node *)parent;
  local_c8 = first_p;
  if (parent == (lyd_node *)0x0 && first_p == (lyd_node **)0x0) {
    __assert_fail("parent || first_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x3f2,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  plVar3 = lydctx->xmlctx;
  local_130 = plVar3->ctx;
  local_b0 = lydctx->parse_opts;
  uVar31 = local_b0 & 0xffbfffff;
  lydctx->parse_opts = uVar31;
  local_a0 = parsed;
  if (plVar3->status != LYXML_ELEMENT) {
    __assert_fail("xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x3fc,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  pcVar21 = (plVar3->field_3).prefix;
  plVar30 = (lyd_meta *)(plVar3->field_4).prefix_len;
  pcVar24 = (plVar3->field_5).name;
  plVar38 = (lyd_meta *)(plVar3->field_6).name_len;
  LVar8 = lyxml_ctx_next(plVar3);
  plVar29 = local_130;
  if (LVar8 != LY_SUCCESS) goto LAB_0012e999;
  uVar36 = lydctx->int_opts;
  local_148 = plVar38;
  local_140 = pcVar24;
  local_138 = pcVar21;
  local_d0 = plVar3;
  if (plVar30 == (lyd_meta *)0x0 &&
      (((char)uVar36 < '\0' && local_118 == (lysc_node *)0x0) && plVar38 != (lyd_meta *)0x0)) {
    iVar9 = ly_strncmp("eventTime",pcVar24,(size_t)plVar38);
    plVar29 = local_130;
    if (iVar9 != 0) {
      uVar36 = lydctx->int_opts;
      goto LAB_0012ea46;
    }
    if (plVar3->status != LYXML_ELEM_CONTENT) {
      __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                    ,0x40b,
                    "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                   );
    }
    if ((plVar3->field_5).ws_only == '\0') {
      sVar22 = (plVar3->field_4).prefix_len;
    }
    else {
      sVar22 = 0;
    }
    LVar8 = lyd_create_opaq(plVar3->ctx,pcVar24,(size_t)local_148,local_138,0,
                            "urn:ietf:params:xml:ns:netconf:notification:1.0",0x2f,
                            (plVar3->field_3).prefix,sVar22,(ly_bool *)0x0,LY_VALUE_XML,(void *)0x0,
                            0x3f3,&node);
    if (LVar8 != LY_SUCCESS) goto LAB_0012e999;
    LVar8 = lyd_parser_notif_eventtime_validate(node);
    if ((LVar8 != LY_SUCCESS) || (LVar8 = lyxml_ctx_next(plVar3), LVar8 != LY_SUCCESS)) {
      lyd_free_tree(node);
      goto LAB_0012e999;
    }
    if (plVar3->status == LYXML_ELEM_CLOSE) {
      plVar19 = (lyd_node *)0x0;
      LVar10 = LY_SUCCESS;
      goto LAB_001300b7;
    }
    ly_vlog(plVar29,(char *)0x0,LYVE_DATA,"Unexpected notification \"eventTime\" node children.");
    lyd_free_tree(node);
LAB_00130095:
    LVar8 = LY_EVALID;
    goto LAB_0012e999;
  }
LAB_0012ea46:
  plVar3 = lydctx->xmlctx;
  ctx = plVar3->ctx;
  snode = (lysc_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  local_f8 = plVar30;
  plVar13 = lyxml_ns_get(&plVar3->ns,local_138,(size_t)plVar30);
  plVar29 = local_130;
  if (plVar13 == (lyxml_ns *)0x0) {
    if ((lydctx->int_opts & 0x10) == 0) {
      lydxml_log_namespace_err(plVar3,local_138,(size_t)local_f8,(char *)0x0,0);
      plVar29 = local_130;
    }
    else {
      if ((lydctx->parse_opts & 0x20000) == 0) goto LAB_0012edac;
      if (local_f8 == (lyd_meta *)0x0) {
        ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"No default namespace in the context.");
      }
      else {
        pcVar24 = "No module with namespace \"%.*s\" in the context.";
        plVar30 = local_f8;
        pcVar21 = local_138;
LAB_0012ed7a:
        ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,pcVar24,plVar30,pcVar21);
      }
    }
  }
  else {
    plVar29 = ctx;
    if (local_118 != (lysc_node *)0x0) {
      if (local_118->module == (lys_module *)0x0) {
        plVar14 = (lys_module *)&local_118[1].name;
      }
      else {
        plVar14 = (lys_module *)local_118->module->name;
      }
      plVar29 = plVar14->ctx;
    }
    plVar14 = ly_ctx_get_module_implemented_ns(plVar29,plVar13->uri);
    if (plVar14 == (lys_module *)0x0) {
      in_stack_fffffffffffffe68 = (lyd_node *)&snode;
      LVar8 = ly_nested_ext_schema
                        ((lyd_node *)local_118,(lysc_node *)0x0,local_138,(size_t)local_f8,
                         LY_VALUE_XML,&lydctx->xmlctx->ns,local_140,(size_t)local_148,
                         (lysc_node **)in_stack_fffffffffffffe68,&ext);
      plVar29 = local_130;
      if (LVar8 == LY_ENOT) {
        if ((lydctx->parse_opts & 0x20000) == 0) goto LAB_0012edac;
        ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"No module with namespace \"%s\" in the context.",
                plVar13->uri);
        goto LAB_0012f277;
      }
    }
    else {
      uVar36 = (uVar36 & 4) << 2;
      if ((local_118 == (lysc_node *)0x0) && (lydctx->ext != (lysc_ext_instance *)0x0)) {
        plVar15 = lysc_ext_find_node(lydctx->ext,plVar14,local_140,(size_t)local_148,0,uVar36);
      }
      else {
        plVar15 = lyd_parser_node_schema((lyd_node *)local_118);
        plVar15 = lys_find_child(plVar15,plVar14,local_140,(size_t)local_148,0,uVar36);
      }
      plVar29 = local_130;
      snode = plVar15;
      if (plVar15 == (lysc_node *)0x0) {
        in_stack_fffffffffffffe68 = (lyd_node *)&snode;
        plVar30 = local_148;
        LVar8 = ly_nested_ext_schema
                          ((lyd_node *)local_118,(lysc_node *)0x0,local_138,(size_t)local_f8,
                           LY_VALUE_XML,&lydctx->xmlctx->ns,local_140,(size_t)local_148,
                           (lysc_node **)in_stack_fffffffffffffe68,&ext);
        if (LVar8 == LY_ENOT) {
          if ((lydctx->parse_opts & 0x20000) == 0) goto LAB_0012edac;
          if (local_118 != (lysc_node *)0x0) {
            pcVar24 = "Node \"%.*s\" not found as a child of \"%s\" node.";
            plVar30 = local_148;
            pcVar21 = local_140;
            goto LAB_0012ed7a;
          }
          plVar4 = lydctx->ext;
          if (plVar4 == (lysc_ext_instance *)0x0) {
            plVar38 = (lyd_meta *)plVar14->name;
            pcVar21 = "Node \"%.*s\" not found in the \"%s\" module.";
          }
          else {
            plVar6 = (lyd_meta *)plVar4->def->name;
            if ((lyd_meta *)plVar4->argument == (lyd_meta *)0x0) {
              pcVar21 = "Node \"%.*s\" not found in the %s extension instance.";
              plVar38 = plVar6;
            }
            else {
              pcVar21 = "Node \"%.*s\" not found in the \"%s\" %s extension instance.";
              plVar38 = (lyd_meta *)plVar4->argument;
              plVar30 = plVar6;
            }
          }
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,pcVar21,local_148,local_140,plVar38,plVar30);
          goto LAB_0012f277;
        }
      }
      else {
        LVar8 = lyd_parser_check_schema((lyd_ctx *)lydctx,plVar15);
        if (LVar8 == LY_SUCCESS) {
          plVar3 = lydctx->xmlctx;
          local_ac = 0;
          LVar8 = LY_SUCCESS;
          if (((lydctx->parse_opts & 0x40000) != 0) && ((plVar15->nodetype & 0x71d) != 0)) {
            if ((plVar3->elements).count == 0) {
              __assert_fail("xmlctx->elements.count",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                            ,0x19b,
                            "LY_ERR lydxml_data_check_opaq(struct lyd_xml_ctx *, const struct lysc_node **)"
                           );
            }
            LVar8 = lyxml_ctx_backup(plVar3,&pxmlctx);
            if (LVar8 == LY_SUCCESS) {
              while (plVar3->status == LYXML_ATTRIBUTE) {
                LVar8 = lyxml_ctx_next(plVar3);
                if ((LVar8 != LY_SUCCESS) || (LVar8 = lyxml_ctx_next(plVar3), LVar8 != LY_SUCCESS))
                goto LAB_0012fe06;
              }
              if ((snode->nodetype & 0xc) == 0) {
                if (snode->nodetype == 0x10) {
                  LVar8 = lyxml_ctx_next(plVar3);
                  plVar15 = snode;
                  if (LVar8 == LY_SUCCESS) {
                    val_prefix_data = (void *)0x0;
                    aStack_e0.dnodes = (lyd_node **)0x0;
                    local_150 = (lyd_ctx *)lydctx;
                    if ((snode == (lysc_node *)0x0) || (snode->nodetype != 0x10)) {
                      __assert_fail("list && (list->nodetype == LYS_LIST)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                    ,0x11d,
                                    "LY_ERR lydxml_check_list(struct lyxml_ctx *, const struct lysc_node *)"
                                   );
                    }
                    last = (lysc_node *)0x0;
                    goto LAB_001302d3;
                  }
                }
                else {
                  if (plVar3->status != LYXML_ELEM_CONTENT) {
                    __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                  ,0x1bb,
                                  "LY_ERR lydxml_data_check_opaq(struct lyd_xml_ctx *, const struct lysc_node **)"
                                 );
                  }
                  LVar8 = LY_SUCCESS;
                  if ((plVar3->field_5).ws_only == '\0') goto LAB_0012ef7e;
                }
              }
              else {
                opts = ly_temp_log_options(&local_ac);
                LVar8 = LY_SUCCESS;
                LVar10 = ly_value_validate((ly_ctx *)0x0,snode,(plVar3->field_3).prefix,
                                           (plVar3->field_4).prefix_len,LY_VALUE_XML,&plVar3->ns,
                                           0x3f3);
                ly_temp_log_options(opts);
                if (LVar10 != LY_SUCCESS) {
                  ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                         "Parsing opaque term node \"%s\" with invalid value \"%.*s\".",snode->name,
                         (ulong)*(uint *)&plVar3->field_4,(plVar3->field_3).prefix);
                  goto LAB_0012ef7e;
                }
              }
              goto LAB_0012fe06;
            }
          }
        }
      }
    }
LAB_0012ed93:
    if (LVar8 == LY_SUCCESS) {
LAB_0012edac:
      plVar3 = local_d0;
      plVar15 = snode;
      if (snode == (lysc_node *)0x0) {
        if ((((lyd_ctx *)lydctx)->parse_opts & 0x40000) == 0) {
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Skipping parsing of unknown node \"%.*s\".",
                 local_148,local_140);
          LVar8 = lydxml_data_skip(plVar3);
          goto LAB_0012e999;
        }
        LVar11 = local_d0->status;
        if (LVar11 != LYXML_ATTRIBUTE) goto LAB_0012f254;
        LVar8 = lydxml_attrs(local_d0,&attr);
        if (LVar8 != LY_SUCCESS) goto LAB_0012f429;
        LVar10 = LY_SUCCESS;
LAB_0012f45d:
        LVar11 = local_d0->status;
      }
      else {
        LVar11 = local_d0->status;
        if (LVar11 == LYXML_ATTRIBUTE) {
          plVar3 = (lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx;
          meta = (lyd_meta *)0x0;
          bVar37 = false;
          local_150 = (lyd_ctx *)lydctx;
          ly_log_location(snode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
          iVar9 = strcmp(plVar15->module->name,"notifications");
          local_d8 = plVar15;
          if (iVar9 != 0) {
            plVar4 = plVar15->exts;
            pvVar32 = (void *)0x0;
            plVar35 = plVar4;
            while( true ) {
              if (plVar4 == (lysc_ext_instance *)0x0) {
                pvVar16 = (void *)0x0;
              }
              else {
                pvVar16 = plVar4[-1].compiled;
              }
              bVar37 = pvVar16 <= pvVar32;
              if (bVar37) break;
              plVar5 = plVar35->def;
              iVar9 = strcmp(plVar5->name,"get-filter-element-attributes");
              if ((iVar9 == 0) && (iVar9 = strcmp(plVar5->module->name,"ietf-netconf"), iVar9 == 0))
              break;
              pvVar32 = (void *)((long)pvVar32 + 1);
              plVar35 = plVar35 + 1;
            }
          }
          local_110 = (lyd_node_inner *)&plVar3->ns;
          local_b8 = (lyd_node *)&plVar3->field_6;
          do {
            while( true ) {
              if (plVar3->status != LYXML_ATTRIBUTE) {
                LVar8 = LY_SUCCESS;
                lydctx = (lyd_xml_ctx *)local_150;
                goto LAB_0012f3f9;
              }
              LVar8 = LY_ENOTFOUND;
              if ((plVar3->field_4).prefix_len == 0) break;
              plVar13 = lyxml_ns_get((ly_set *)local_110,(plVar3->field_3).prefix,
                                     (plVar3->field_4).prefix_len);
              if (plVar13 == (lyxml_ns *)0x0) {
                lydxml_log_namespace_err
                          (plVar3,(plVar3->field_3).prefix,(plVar3->field_4).prefix_len,
                           (plVar3->field_5).name,(plVar3->field_6).name_len);
                lydctx = (lyd_xml_ctx *)local_150;
                goto LAB_0012f3f9;
              }
              plVar14 = ly_ctx_get_module_implemented_ns(plVar3->ctx,plVar13->uri);
              if (plVar14 == (lys_module *)0x0) {
                if ((local_150->parse_opts & 0x20000) == 0) {
                  LVar8 = lyxml_ctx_next(plVar3);
                  lydctx = (lyd_xml_ctx *)local_150;
                  if (LVar8 == LY_SUCCESS) {
                    if (plVar3->status != LYXML_ATTR_CONTENT) {
                      __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                    ,0xab,
                                    "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                                   );
                    }
                    goto LAB_0012f0c6;
                  }
                }
                else {
                  pcVar21 = ":";
                  if ((plVar3->field_4).prefix_len == 0) {
                    pcVar21 = "";
                  }
                  ly_vlog(plVar3->ctx,(char *)0x0,LYVE_REFERENCE,
                          "Unknown (or not implemented) YANG module with namespace \"%s\" for metadata \"%.*s%s%.*s\"."
                          ,plVar13->uri,(plVar3->field_4).prefix_len,(plVar3->field_3).prefix,
                          pcVar21,CONCAT44((int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                           *(undefined4 *)&plVar3->field_6),(plVar3->field_5).name);
                  lydctx = (lyd_xml_ctx *)local_150;
                }
                goto LAB_0012f3f9;
              }
LAB_0012f0f4:
              pcVar21 = (plVar3->field_5).name;
              sVar22 = (plVar3->field_6).name_len;
              LVar8 = lyxml_ctx_next(plVar3);
              lydctx = (lyd_xml_ctx *)local_150;
              if (LVar8 != LY_SUCCESS) goto LAB_0012f3f9;
              if (plVar3->status != LYXML_ATTR_CONTENT) {
                __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0xb5,
                              "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                             );
              }
              in_stack_fffffffffffffe68 = local_b8;
              LVar8 = lyd_parser_create_meta
                                (local_150,(lyd_node *)0x0,&meta,plVar14,pcVar21,sVar22,
                                 (plVar3->field_3).prefix,(plVar3->field_4).prefix_len,
                                 (ly_bool *)local_b8,LY_VALUE_XML,local_110,0x3f3,local_d8);
              lydctx = (lyd_xml_ctx *)local_150;
              if ((LVar8 != LY_SUCCESS) ||
                 (LVar8 = lyxml_ctx_next(plVar3), lydctx = (lyd_xml_ctx *)local_150,
                 LVar8 != LY_SUCCESS)) goto LAB_0012f3f9;
            }
            if ((!bVar37) &&
               ((iVar9 = ly_strncmp("type",(plVar3->field_5).name,(plVar3->field_6).name_len),
                iVar9 == 0 ||
                (iVar9 = ly_strncmp("select",(plVar3->field_5).name,(plVar3->field_6).name_len),
                iVar9 == 0)))) {
              plVar14 = ly_ctx_get_module_implemented(plVar3->ctx,"ietf-netconf");
              if (plVar14 != (lys_module *)0x0) goto LAB_0012f0f4;
              ly_vlog(plVar3->ctx,(char *)0x0,LYVE_REFERENCE,
                      "Missing (or not implemented) YANG module \"ietf-netconf\" for special filter attributes."
                     );
              lydctx = (lyd_xml_ctx *)local_150;
              break;
            }
            lydctx = (lyd_xml_ctx *)local_150;
            if ((local_150->parse_opts & 0x20000) != 0) {
              ly_vlog(plVar3->ctx,(char *)0x0,LYVE_REFERENCE,
                      "Missing mandatory prefix for XML metadata \"%.*s\".",
                      (ulong)*(uint *)&plVar3->field_6,(plVar3->field_5).name);
              plVar17 = ly_err_last(((lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx)->ctx);
              if (((((lyd_ctx *)lydctx)->val_opts & 4) == 0) || (plVar17->vecode == LYVE_SYNTAX)) {
                LVar8 = LY_EVALID;
                break;
              }
            }
            LVar8 = lyxml_ctx_next(plVar3);
            if (LVar8 != LY_SUCCESS) break;
            if (plVar3->status != LYXML_ATTR_CONTENT) {
              __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                            ,0x90,
                            "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                           );
            }
LAB_0012f0c6:
            LVar8 = lyxml_ctx_next(plVar3);
            lydctx = (lyd_xml_ctx *)local_150;
          } while (LVar8 == LY_SUCCESS);
LAB_0012f3f9:
          LVar10 = LY_SUCCESS;
          ly_log_location_revert(1,0,0,0);
          plVar29 = local_130;
          if (LVar8 != LY_SUCCESS) {
            lyd_free_meta_siblings(meta);
            meta = (lyd_meta *)0x0;
LAB_0012f429:
            plVar17 = ly_err_last(((lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx)->ctx);
            if (LVar8 != LY_EVALID) goto LAB_0012e999;
            if ((((lyd_ctx *)lydctx)->val_opts & 4) == 0) goto LAB_00130095;
            LVar10 = LY_EVALID;
            LVar8 = LVar10;
            if (plVar17->vecode == LYVE_SYNTAX) goto LAB_0012e999;
          }
          goto LAB_0012f45d;
        }
LAB_0012f254:
        LVar10 = LY_SUCCESS;
      }
      plVar4 = ext;
      if (LVar11 != LYXML_ELEM_CONTENT) {
        __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                      ,0x440,
                      "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                     );
      }
      if (snode == (lysc_node *)0x0) {
        if (local_118 == (lysc_node *)0x0) {
          plVar19 = *local_c8;
        }
        else {
          plVar19 = lyd_child((lyd_node *)local_118);
        }
        plVar3 = (lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx;
        val_prefix_data = (void *)0x0;
        local_150 = (lyd_ctx *)lydctx;
        if ((((lyd_ctx *)lydctx)->parse_opts & 0x40000) == 0) {
          __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                        ,0x29f,
                        "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                       );
        }
        node = (lyd_node *)0x0;
        local_d8 = (lysc_node *)(plVar3->field_3).prefix;
        sVar22 = (plVar3->field_4).prefix_len;
        local_110 = (lyd_node_inner *)
                    CONCAT44(local_110._4_4_,
                             (int)CONCAT71((int7)((ulong)plVar19 >> 8),(plVar3->field_6).dynamic));
        if ((plVar3->field_6).dynamic != '\0') {
          (plVar3->field_6).dynamic = '\0';
        }
        local_121 = (plVar3->field_5).ws_only;
        local_b8 = plVar19;
        LVar8 = ly_store_prefix_data
                          (plVar3->ctx,local_d8,sVar22,LY_VALUE_XML,&plVar3->ns,&next,
                           &val_prefix_data);
        if (LVar8 == LY_SUCCESS) {
          local_f8 = (lyd_meta *)((ulong)local_f8 & 0xffffffff);
          local_a8 = sVar22;
          plVar13 = lyxml_ns_get(&plVar3->ns,local_138,(size_t)local_f8);
          if (plVar13 == (lyxml_ns *)0x0) {
            pcVar21 = (char *)0x0;
          }
          else {
            pcVar21 = plVar13->uri;
          }
          uVar28 = (ulong)local_148 & 0xffffffff;
          __n = (plVar3->field_4).prefix_len;
          if (__n == 0) {
            local_148 = (lyd_meta *)CONCAT44(local_148._4_4_,0x41);
          }
          else {
            pcVar24 = (plVar3->field_3).prefix;
            iVar9 = strncmp(pcVar24,"true",__n);
            local_148 = (lyd_meta *)CONCAT44(local_148._4_4_,0x20);
            if ((iVar9 != 0) && (iVar9 = strncmp(pcVar24,"false",__n), iVar9 != 0)) {
              lVar20 = strtoll(pcVar24,(char **)&pxmlctx,10);
              if ((uint)((int)pxmlctx.ctx - (int)pcVar24) == __n) {
                local_148 = (lyd_meta *)
                            (CONCAT44(local_148._4_4_,
                                      (uint)(lVar20 - 0x100000000U < 0xfffffffe80000000) << 4) | 2);
              }
              else {
                local_148 = (lyd_meta *)CONCAT44(local_148._4_4_,1);
              }
            }
          }
          if (local_b8 == (lyd_node *)0x0) {
            plVar19 = (lyd_node *)0x0;
          }
          else {
            plVar19 = (lyd_node *)((anon_union_8_3_0df1e6ad_for_ly_set_2 *)&local_b8->prev)->dnodes;
            do {
              if (plVar19->schema == (lysc_node *)0x0) {
                if (*(int *)((long)&plVar19[1].meta + 4) != 3) {
                  __assert_fail("opaq->format == LY_VALUE_XML",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                ,0x201,
                                "void lydxml_get_hints_opaq(const char *, size_t, const char *, size_t, const struct lyd_node *, const char *, uint32_t *, struct lyd_node **)"
                               );
                }
                iVar9 = ly_strncmp((char *)plVar19[1].schema,local_140,uVar28);
                if (iVar9 == 0) {
                  plVar18 = plVar19[1].next;
                  if (pcVar21 == (char *)0x0) {
                    if (plVar18 == (lyd_node *)0x0) goto LAB_0012fa64;
                  }
                  else if ((plVar18 != (lyd_node *)0x0) &&
                          (iVar9 = strcmp((char *)plVar18,pcVar21), iVar9 == 0)) {
LAB_0012fa64:
                    if ((plVar19[1].prev == (lyd_node *)0x0) ||
                       (uVar12 = 0x100, (char)(plVar19[1].prev)->hash == '\0')) {
                      uVar12 = 0x80;
                    }
                    *(uint *)&plVar19[1].meta = *(uint *)&plVar19[1].meta | uVar12;
                    local_148 = (lyd_meta *)CONCAT44(local_148._4_4_,(uint)local_148 | uVar12);
                    goto LAB_0012fa91;
                  }
                }
              }
              plVar19 = plVar19->prev;
            } while (plVar19->next != (lyd_node *)0x0);
            plVar19 = (lyd_node *)0x0;
          }
LAB_0012fa91:
          plVar29 = plVar3->ctx;
          if (pcVar21 == (char *)0x0) {
            sVar22 = 0;
          }
          else {
            sVar22 = strlen(pcVar21);
          }
          LVar8 = lyd_create_opaq(plVar29,local_140,uVar28,local_138,(size_t)local_f8,pcVar21,sVar22
                                  ,(char *)0x0,0,(ly_bool *)0x0,next,(void *)0x0,(uint)local_148,
                                  &node);
          plVar29 = local_130;
          if (LVar8 == LY_SUCCESS) {
            if (node == (lyd_node *)0x0) {
              __assert_fail("*node",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                            ,700,
                            "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                           );
            }
            ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
            LVar8 = lyxml_ctx_next(plVar3);
            plVar29 = local_130;
            plVar18 = node;
            while (node = plVar18, LVar8 == LY_SUCCESS) {
              if (plVar3->status != LYXML_ELEMENT) {
                lVar7._0_4_ = plVar18[1].hash;
                lVar7._4_4_ = plVar18[1].flags;
                cVar34 = (char)local_110;
                if (lVar7 == 0) {
                  if (local_a8 != 0) {
                    lydict_remove(plVar3->ctx,(char *)plVar18[1].prev);
                    if ((char)local_110 == '\0') {
                      LVar8 = lydict_insert(plVar3->ctx,(char *)local_d8,local_a8,
                                            (char **)&plVar18[1].prev);
                      plVar29 = local_130;
                      if (LVar8 != LY_SUCCESS) {
                        cVar34 = '\0';
                        goto LAB_0012fb50;
                      }
                    }
                    else {
                      LVar8 = lydict_insert_zc(plVar3->ctx,(char *)local_d8,
                                               (char **)&plVar18[1].prev);
                      if (LVar8 != LY_SUCCESS) {
                        cVar34 = '\x01';
                        goto LAB_0012fb50;
                      }
                    }
                    cVar34 = '\0';
                  }
                }
                else if (local_121 == '\0') {
                  pplVar33 = &plVar18[1].schema;
                  if (plVar18->schema != (lysc_node *)0x0) {
                    pplVar33 = (lysc_node **)&plVar18->schema->name;
                  }
                  LVar8 = LY_EVALID;
                  ly_vlog(plVar3->ctx,(char *)0x0,LYVE_SYNTAX_XML,
                          "Mixed XML content node \"%s\" found, not supported.",*pplVar33);
                  goto LAB_0012fb50;
                }
                if (plVar18[1].priv != (void *)0x0) {
                  __assert_fail("!opaq->val_prefix_data",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                ,0x2dc,
                                "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                               );
                }
                plVar18[1].priv = val_prefix_data;
                val_prefix_data = (void *)0x0;
                LVar8 = LY_SUCCESS;
                goto LAB_0012fb50;
              }
              pplVar23 = lyd_node_child_p(plVar18);
              LVar8 = lydxml_subtree_r((lyd_xml_ctx *)local_150,plVar18,pplVar23,(ly_set *)0x0);
              plVar18 = node;
            }
          }
        }
        else {
          plVar19 = (lyd_node *)0x0;
        }
        cVar34 = (char)local_110;
LAB_0012fb50:
        if (node != (lyd_node *)0x0) {
          ly_log_location_revert(0,1,0,0);
        }
        ly_free_prefix_data(next,val_prefix_data);
        if (cVar34 != '\0') {
          free(local_d8);
        }
        lydctx = (lyd_xml_ctx *)local_150;
        if (LVar8 != LY_SUCCESS) {
          lyd_free_tree(node);
          node = (lyd_node *)0x0;
        }
LAB_0012ff3f:
        if (LVar8 != LY_SUCCESS) goto LAB_00130073;
      }
      else {
        uVar2 = snode->nodetype;
        local_150 = (lyd_ctx *)snode;
        if ((uVar2 & 0xc) == 0) {
          if ((uVar2 & 0x711) == 0) {
            if ((uVar2 & 0x60) == 0) {
              __assert_fail("snode->nodetype & LYD_NODE_ANY",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                            ,0x44d,
                            "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                           );
            }
            plVar3 = (lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx;
            local_138 = (char *)CONCAT44(local_138._4_4_,((lyd_ctx *)lydctx)->parse_opts);
            local_148 = (lyd_meta *)CONCAT44(local_148._4_4_,((lyd_ctx *)lydctx)->int_opts);
            pxmlctx.ctx = (ly_ctx *)0x0;
            node = (lyd_node *)0x0;
            LVar27 = LY_SUCCESS;
            if ((uVar2 == 0x60) && ((plVar3->field_5).ws_only == '\0')) {
              uVar28 = 0x14;
              if ((plVar3->field_4).prefix_len < 0x14) {
                uVar28 = (plVar3->field_4).prefix_len;
              }
              ly_vlog(plVar3->ctx,(char *)0x0,LYVE_SYNTAX,
                      "Text value \"%.*s\" inside an anydata node \"%s\" found.",uVar28,
                      (plVar3->field_3).prefix,snode->name);
              plVar17 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
              if ((((lyd_ctx *)lydctx)->val_opts & 4) == 0) {
                LVar8 = LY_EVALID;
              }
              else {
                LVar8 = LY_EVALID;
                LVar27 = LVar8;
                if (plVar17->vecode != LYVE_SYNTAX) goto LAB_0012f785;
              }
LAB_0012feee:
              pcVar21 = (char *)0x0;
              plVar29 = local_130;
            }
            else {
LAB_0012f785:
              if ((plVar3->field_5).ws_only != '\0') {
                LVar8 = lyd_create_any((lysc_node *)local_150,(void *)0x0,LYD_ANYDATA_DATATREE,
                                       '\x01',&node);
                if (LVar8 == LY_SUCCESS) {
                  if (node == (lyd_node *)0x0) {
                    __assert_fail("*node",
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                  ,0x3b2,
                                  "LY_ERR lydxml_subtree_any(struct lyd_xml_ctx *, const struct lysc_node *, const struct lysc_ext_instance *, struct lyd_node **)"
                                 );
                  }
                  ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
                  LVar8 = lyxml_ctx_next(plVar3);
                  if (LVar8 == LY_SUCCESS) {
                    local_140 = (char *)CONCAT44(local_140._4_4_,LVar27);
                    ((lyd_ctx *)lydctx)->parse_opts =
                         (uint)(plVar4 != (lysc_ext_instance *)0x0) << 0x10 |
                         ((lyd_ctx *)lydctx)->parse_opts & 0xfff9ffff | 0x40000;
                    *(byte *)&((lyd_ctx *)lydctx)->int_opts =
                         (byte)((lyd_ctx *)lydctx)->int_opts | 0x30;
                    do {
                      do {
                        if (plVar3->status != LYXML_ELEMENT) {
                          *(ly_ctx **)(node + 1) = pxmlctx.ctx;
                          pxmlctx.ctx = (ly_ctx *)0x0;
                          LVar8 = (LY_ERR)local_140;
                          goto LAB_0012fedd;
                        }
                        LVar8 = lydxml_subtree_r(lydctx,(lyd_node *)0x0,(lyd_node **)&pxmlctx,
                                                 (ly_set *)0x0);
                      } while (LVar8 == LY_SUCCESS);
                      plVar17 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
                      if (LVar8 != LY_EVALID) break;
                      if ((((lyd_ctx *)lydctx)->val_opts & 4) == 0) {
                        LVar8 = LY_EVALID;
                        break;
                      }
                      LVar8 = LY_EVALID;
                      local_140 = (char *)CONCAT44(local_140._4_4_,7);
                    } while (plVar17->vecode != LYVE_SYNTAX);
                  }
LAB_0012fedd:
                  ly_log_location_revert(0,1,0,0);
                }
                goto LAB_0012feee;
              }
              pcVar21 = strndup((plVar3->field_3).prefix,(plVar3->field_4).prefix_len);
              plVar29 = local_130;
              if (pcVar21 == (char *)0x0) {
                ly_log(plVar3->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lydxml_subtree_any");
                pcVar21 = (char *)0x0;
                LVar8 = LY_EMEM;
              }
              else {
                LVar8 = lyxml_ctx_next(plVar3);
                if (LVar8 == LY_SUCCESS) {
                  LVar8 = lyd_create_any((lysc_node *)local_150,pcVar21,LYD_ANYDATA_STRING,'\x01',
                                         &node);
                  if (LVar8 == LY_SUCCESS) {
                    pcVar21 = (char *)0x0;
                    LVar8 = LVar27;
                  }
                }
              }
            }
            ((lyd_ctx *)lydctx)->parse_opts = (uint32_t)local_138;
            ((lyd_ctx *)lydctx)->int_opts = (uint)local_148;
            free(pcVar21);
            lyd_free_tree((lyd_node *)pxmlctx.ctx);
            if ((LVar8 != LY_SUCCESS) &&
               (((((lyd_ctx *)lydctx)->val_opts & 4) == 0 || (LVar8 != LY_EVALID)))) {
              lyd_free_tree(node);
              node = (lyd_node *)0x0;
            }
            plVar19 = (lyd_node *)0x0;
            goto LAB_0012ff3f;
          }
          plVar3 = (lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx;
          local_138 = (char *)CONCAT44(local_138._4_4_,((lyd_ctx *)lydctx)->parse_opts);
          node = (lyd_node *)0x0;
          if ((plVar3->field_5).ws_only == '\0') {
            ly_vlog(plVar3->ctx,(char *)0x0,LYVE_SYNTAX,
                    "Text value \"%.*s\" inside an inner node \"%s\" found.",
                    (ulong)*(uint *)&plVar3->field_4,(plVar3->field_3).prefix,snode->name);
            plVar17 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
            LVar8 = LY_EVALID;
            if (((((lyd_ctx *)lydctx)->val_opts & 4) != 0) && (plVar17->vecode != LYVE_SYNTAX))
            goto LAB_0012f561;
          }
          else {
LAB_0012f561:
            LVar8 = lyd_create_inner((lysc_node *)local_150,&node);
            if (LVar8 == LY_SUCCESS) {
              if (node == (lyd_node *)0x0) {
                __assert_fail("*node",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0x34f,
                              "LY_ERR lydxml_subtree_inner(struct lyd_xml_ctx *, const struct lysc_node *, const struct lysc_ext_instance *, struct lyd_node **)"
                             );
              }
              ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
              LVar8 = lyxml_ctx_next(plVar3);
              if (LVar8 == LY_SUCCESS) {
                if (plVar4 != (lysc_ext_instance *)0x0) {
                  pbVar1 = (byte *)((long)&((lyd_ctx *)lydctx)->parse_opts + 2);
                  *pbVar1 = *pbVar1 | 1;
                }
                local_148 = (lyd_meta *)0x0;
                LVar27 = LY_EVALID;
                local_140 = (char *)((ulong)local_140 & 0xffffffff00000000);
                while (plVar19 = node, plVar3->status == LYXML_ELEMENT) {
                  pplVar23 = lyd_node_child_p(node);
                  uVar25 = 0;
                  LVar8 = lydxml_subtree_r(lydctx,plVar19,pplVar23,(ly_set *)0x0);
                  if (LVar8 != LY_SUCCESS) {
                    plVar17 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
                    if ((LVar8 != LY_EVALID) ||
                       (LVar8 = LVar27, (((lyd_ctx *)lydctx)->val_opts & 4) == 0))
                    goto LAB_0013001e;
                    local_148 = (lyd_meta *)CONCAT71((int7)((ulong)uVar25 >> 8),1);
                    local_140 = (char *)CONCAT44(local_140._4_4_,7);
                    if (plVar17->vecode == LYVE_SYNTAX) goto LAB_0013001e;
                  }
                }
                ((lyd_ctx *)lydctx)->parse_opts = (uint32_t)local_138;
                LVar26 = (LY_ERR)local_140;
                uVar36 = (uint32_t)local_138;
                if (*(short *)&local_150->ext == 0x10) {
                  LVar8 = lyd_parser_check_keys(node);
                  if (LVar8 != LY_SUCCESS) goto LAB_0013001e;
                  uVar36 = ((lyd_ctx *)lydctx)->parse_opts;
                }
                if ((((byte)(uVar36 >> 0x10) | (byte)local_148) & 1) == 0) {
                  LVar8 = lyd_parser_validate_new_implicit((lyd_ctx *)lydctx,node);
                  if (LVar8 == LY_SUCCESS) {
                    LVar26 = LY_SUCCESS;
                  }
                  else {
                    plVar17 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
                    if (((LVar8 != LY_EVALID) ||
                        (LVar8 = LVar27, (((lyd_ctx *)lydctx)->val_opts & 4) == 0)) ||
                       (LVar26 = LY_EVALID, LVar8 = LVar26, plVar17->vecode == LYVE_SYNTAX))
                    goto LAB_0013001e;
                  }
                }
                LVar8 = LVar26;
                if (((ulong)local_150->ext & 0x700) != 0) {
                  ((lyd_ctx *)lydctx)->op_node = node;
                }
              }
            }
          }
LAB_0013001e:
          if (node != (lyd_node *)0x0) {
            ly_log_location_revert(0,1,0,0);
          }
          ((lyd_ctx *)lydctx)->parse_opts = (uint32_t)local_138;
          plVar29 = local_130;
          if (LVar8 == LY_SUCCESS) {
            plVar19 = (lyd_node *)0x0;
            goto LAB_001300b7;
          }
          if (((node == (lyd_node *)0x0) || (node->hash != 0)) &&
             (((((lyd_ctx *)lydctx)->val_opts & 4) != 0 && (LVar8 == LY_EVALID))))
          goto LAB_0013006e;
        }
        else {
          plVar3 = (lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx;
          node = (lyd_node *)0x0;
          LVar8 = lyd_parser_create_term
                            ((lyd_ctx *)lydctx,snode,(plVar3->field_3).prefix,
                             (plVar3->field_4).prefix_len,&(plVar3->field_6).dynamic,LY_VALUE_XML,
                             &plVar3->ns,0x3f3,&node);
          if (LVar8 == LY_SUCCESS) {
            LVar8 = LY_SUCCESS;
LAB_0012f5a6:
            LVar27 = LVar8;
            if (node != (lyd_node *)0x0) {
              local_140 = (char *)CONCAT44(local_140._4_4_,LVar8);
              bVar37 = local_118 != (lysc_node *)0x0;
              ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
              plVar19 = node;
              LVar27 = (LY_ERR)local_140;
              if ((node != (lyd_node *)0x0 && bVar37) && (((ulong)local_150->ext & 0x1000000) != 0))
              {
                plVar18 = lyd_child((lyd_node *)local_118);
                plVar19 = lyd_insert_get_next_anchor(plVar18,plVar19);
                if ((plVar19 != (lyd_node *)0x0) &&
                   ((plVar19->schema != (lysc_node *)0x0 && ((plVar19->schema->flags & 0x100) != 0))
                   )) {
                  if ((((lyd_ctx *)lydctx)->parse_opts & 0x20000) == 0) {
                    ly_log(plVar3->ctx,LY_LLWRN,LY_SUCCESS,
                           "Invalid position of the key \"%s\" in a list.");
                  }
                  else {
                    ly_vlog(plVar3->ctx,(char *)0x0,LYVE_DATA,
                            "Invalid position of the key \"%s\" in a list.",
                            *(undefined8 *)(local_150->path + 0x10));
                    plVar17 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
                    if ((((lyd_ctx *)lydctx)->val_opts & 4) == 0) goto LAB_0012f939;
                    LVar8 = LY_EVALID;
                    LVar27 = LVar8;
                    if (plVar17->vecode == LYVE_SYNTAX) goto LAB_0012f93c;
                  }
                }
              }
            }
            LVar8 = lyxml_ctx_next(plVar3);
            if ((LVar8 == LY_SUCCESS) && (LVar8 = LVar27, plVar3->status == LYXML_ELEMENT)) {
              ly_vlog(plVar3->ctx,(char *)0x0,LYVE_SYNTAX,
                      "Child element \"%.*s\" inside a terminal node \"%s\" found.",
                      (ulong)*(uint *)&plVar3->field_6,(plVar3->field_5).name,
                      *(undefined8 *)(local_150->path + 0x10));
              ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
LAB_0012f939:
              LVar8 = LY_EVALID;
            }
          }
          else {
            plVar17 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
            if (LVar8 == LY_EVALID) {
              if ((((lyd_ctx *)lydctx)->val_opts & 4) == 0) goto LAB_0012f939;
              LVar8 = LY_EVALID;
              if (plVar17->vecode != LYVE_SYNTAX) goto LAB_0012f5a6;
            }
          }
LAB_0012f93c:
          if (node != (lyd_node *)0x0) {
            ly_log_location_revert(0,1,0,0);
          }
          if (LVar8 == LY_SUCCESS) {
            plVar19 = (lyd_node *)0x0;
            goto LAB_001300b7;
          }
          if ((LVar8 == LY_EVALID) && ((((lyd_ctx *)lydctx)->val_opts & 4) != 0)) {
LAB_0013006e:
            plVar19 = (lyd_node *)0x0;
            LVar8 = LY_EVALID;
            goto LAB_00130073;
          }
        }
        lyd_free_tree(node);
        node = (lyd_node *)0x0;
        plVar19 = (lyd_node *)0x0;
LAB_00130073:
        plVar17 = ly_err_last(((lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx)->ctx);
        if (LVar8 != LY_EVALID) goto LAB_0012e999;
        if ((((lyd_ctx *)lydctx)->val_opts & 4) == 0) goto LAB_00130095;
        LVar10 = LY_EVALID;
        LVar8 = LVar10;
        if (plVar17->vecode == LYVE_SYNTAX) goto LAB_0012e999;
      }
LAB_001300b7:
      if ((node == (lyd_node *)0x0) || (snode == (lysc_node *)0x0)) {
LAB_00130146:
        if (local_d0->status != LYXML_ELEM_CLOSE) {
          __assert_fail("xmlctx->status == LYXML_ELEM_CLOSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                        ,0x460,
                        "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                       );
        }
        if (((local_b0 >> 0x16 & 1) != 0) || (LVar8 = lyxml_ctx_next(local_d0), LVar8 == LY_SUCCESS)
           ) {
          set = local_a0;
          LVar8 = LVar10;
          if (node != (lyd_node *)0x0) {
            if (snode == (lysc_node *)0x0) {
              lyd_insert_attr(node,attr);
              attr = (lyd_attr *)0x0;
            }
            else {
              lyd_insert_meta(node,meta,'\0');
              meta = (lyd_meta *)0x0;
            }
            if (plVar19 == (lyd_node *)0x0) {
              if (ext == (lysc_ext_instance *)0x0) {
                lyd_insert_node((lyd_node *)local_118,local_c8,node,
                                ((lyd_ctx *)lydctx)->parse_opts >> 0x15 & 1);
              }
              else {
                LVar8 = lyplg_ext_insert((lyd_node *)local_118,node);
                if (LVar8 != LY_SUCCESS) {
                  lyd_free_tree(node);
                  goto LAB_0012e999;
                }
              }
            }
            else {
              lyd_insert_after(plVar19,node);
            }
            if (local_118 == (lysc_node *)0x0) {
              plVar19 = *local_c8;
              while (plVar19 = plVar19->prev, plVar19->next != (lyd_node *)0x0) {
                *local_c8 = plVar19;
              }
            }
            LVar8 = LVar10;
            if (set != (ly_set *)0x0) {
              ly_set_add(set,node,'\x01',(uint32_t *)0x0);
            }
          }
          goto LAB_0012e999;
        }
      }
      else {
        LVar8 = lyd_parser_set_data_flags(node,&meta,(lyd_ctx *)lydctx,ext);
        if (LVar8 == LY_SUCCESS) {
          if ((((((lyd_ctx *)lydctx)->parse_opts & 0x10000) == 0) &&
              (LVar8 = lyd_validate_node_ext(node,&((lyd_ctx *)lydctx)->ext_node),
              LVar8 != LY_SUCCESS)) &&
             ((plVar17 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx), LVar8 != LY_EVALID ||
              ((LVar8 = LY_EVALID, (((lyd_ctx *)lydctx)->val_opts & 4) == 0 ||
               (LVar10 = LY_EVALID, LVar8 = LVar10, plVar17->vecode == LYVE_SYNTAX))))))
          goto LAB_0012e999;
          goto LAB_00130146;
        }
      }
      lyd_free_tree(node);
      goto LAB_0012e999;
    }
    if (LVar8 != LY_EVALID) goto LAB_0012e999;
  }
LAB_0012f277:
  LVar8 = LY_EVALID;
  if ((((lyd_ctx *)lydctx)->val_opts & 4) != 0) {
    LVar10 = lydxml_data_skip(local_d0);
    LVar8 = LY_EVALID;
    if (LVar10 != LY_SUCCESS) {
      LVar8 = LVar10;
    }
  }
LAB_0012e999:
  ((lyd_ctx *)lydctx)->parse_opts = uVar31;
  lyd_free_meta_siblings(meta);
  lyd_free_attr_siblings(plVar29,attr);
  return LVar8;
  while (LVar8 = ly_set_add((ly_set *)&val_prefix_data,last,'\x01',(uint32_t *)0x0),
        LVar8 == LY_SUCCESS) {
LAB_001302d3:
    last = lys_getnext(last,plVar15,(lysc_module *)0x0,0);
    if ((last == (lysc_node *)0x0) || ((last->flags & 0x100) == 0)) {
      uVar12 = (plVar3->elements).count;
      goto LAB_0013034a;
    }
  }
LAB_00130305:
  ly_set_erase((ly_set *)&val_prefix_data,(_func_void_void_ptr *)0x0);
LAB_0013031c:
  lydctx = (lyd_xml_ctx *)local_150;
  ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
         "Parsing opaque list node \"%s\" with missing/invalid keys.",snode->name);
LAB_0012ef7e:
  snode = (lysc_node *)0x0;
  LVar8 = LY_SUCCESS;
LAB_0012fe06:
  lyxml_ctx_restore(plVar3,&pxmlctx);
  goto LAB_0012ed93;
LAB_0013034a:
  if (plVar3->status == LYXML_ELEMENT) {
    for (uVar28 = 0; uVar28 < (ulong)val_prefix_data >> 0x20; uVar28 = uVar28 + 1) {
      last = (lysc_node *)aStack_e0.dnodes[uVar28];
      iVar9 = ly_strncmp(last->name,(plVar3->field_5).name,(plVar3->field_6).name_len);
      if (iVar9 == 0) break;
    }
    do {
      LVar8 = lyxml_ctx_next(plVar3);
      if (LVar8 != LY_SUCCESS) goto LAB_00130305;
      if (plVar3->status != LYXML_ATTRIBUTE) goto code_r0x001303be;
      LVar8 = lyxml_ctx_next(plVar3);
      if (LVar8 != LY_SUCCESS) goto LAB_00130305;
      if (plVar3->status != LYXML_ATTR_CONTENT) {
        __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                      ,0x136,
                      "LY_ERR lydxml_check_list(struct lyxml_ctx *, const struct lysc_node *)");
      }
    } while( true );
  }
  iVar9 = val_prefix_data._4_4_;
  LVar8 = LY_SUCCESS;
  ly_set_erase((ly_set *)&val_prefix_data,(_func_void_void_ptr *)0x0);
  lydctx = (lyd_xml_ctx *)local_150;
  if (iVar9 == 0) goto LAB_0012fe06;
  goto LAB_0013031c;
code_r0x001303be:
  if (plVar3->status != LYXML_ELEM_CONTENT) {
    __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x13a,"LY_ERR lydxml_check_list(struct lyxml_ctx *, const struct lysc_node *)");
  }
  if (((uint)uVar28 < val_prefix_data._4_4_) &&
     (LVar8 = ly_value_validate((ly_ctx *)0x0,last,(plVar3->field_3).prefix,
                                (plVar3->field_4).prefix_len,LY_VALUE_XML,&plVar3->ns,0x3f3),
     LVar8 == LY_SUCCESS)) {
    ly_set_rm_index((ly_set *)&val_prefix_data,(uint)uVar28,(_func_void_void_ptr *)0x0);
  }
  while( true ) {
    LVar8 = lyxml_ctx_next(plVar3);
    if (LVar8 != LY_SUCCESS) goto LAB_00130305;
    if (plVar3->status != LYXML_ELEMENT) break;
    while (uVar12 < (plVar3->elements).count) {
      LVar8 = lyxml_ctx_next(plVar3);
      if (LVar8 != LY_SUCCESS) goto LAB_00130305;
    }
    if (plVar3->status != LYXML_ELEM_CLOSE) {
      __assert_fail("xmlctx->status == LYXML_ELEM_CLOSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                    ,0x14c,"LY_ERR lydxml_check_list(struct lyxml_ctx *, const struct lysc_node *)")
      ;
    }
  }
  if (plVar3->status != LYXML_ELEM_CLOSE) {
    __assert_fail("xmlctx->status == LYXML_ELEM_CLOSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x151,"LY_ERR lydxml_check_list(struct lyxml_ctx *, const struct lysc_node *)");
  }
  LVar8 = lyxml_ctx_peek(plVar3,&next);
  if ((LVar8 != LY_SUCCESS) ||
     ((next != LYXML_ELEM_CLOSE && (LVar8 = lyxml_ctx_next(plVar3), LVar8 != LY_SUCCESS))))
  goto LAB_00130305;
  goto LAB_0013034a;
}

Assistant:

static LY_ERR
lydxml_subtree_r(struct lyd_xml_ctx *lydctx, struct lyd_node *parent, struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR r, rc = LY_SUCCESS;
    const char *prefix, *name;
    size_t prefix_len, name_len;
    struct lyxml_ctx *xmlctx;
    const struct ly_ctx *ctx;
    struct lyd_meta *meta = NULL;
    struct lyd_attr *attr = NULL;
    const struct lysc_node *snode = NULL;
    struct lysc_ext_instance *ext = NULL;
    uint32_t orig_parse_opts;
    struct lyd_node *node = NULL, *insert_anchor = NULL;
    ly_bool parse_subtree;

    assert(parent || first_p);

    xmlctx = lydctx->xmlctx;
    ctx = xmlctx->ctx;

    parse_subtree = lydctx->parse_opts & LYD_PARSE_SUBTREE ? 1 : 0;
    /* all descendants should be parsed */
    lydctx->parse_opts &= ~LYD_PARSE_SUBTREE;
    orig_parse_opts = lydctx->parse_opts;

    assert(xmlctx->status == LYXML_ELEMENT);

    /* remember element prefix and name */
    prefix = xmlctx->prefix;
    prefix_len = xmlctx->prefix_len;
    name = xmlctx->name;
    name_len = xmlctx->name_len;

    /* parser next */
    rc = lyxml_ctx_next(xmlctx);
    LY_CHECK_GOTO(rc, cleanup);

    if ((lydctx->int_opts & LYD_INTOPT_EVENTTIME) && !parent && name_len && !prefix_len &&
            !ly_strncmp("eventTime", name, name_len)) {
        /* parse eventTime, create node */
        assert(xmlctx->status == LYXML_ELEM_CONTENT);
        rc = lyd_create_opaq(xmlctx->ctx, name, name_len, prefix, prefix_len,
                "urn:ietf:params:xml:ns:netconf:notification:1.0", 47, xmlctx->value,
                xmlctx->ws_only ? 0 : xmlctx->value_len, NULL, LY_VALUE_XML, NULL, LYD_HINT_DATA, &node);
        LY_CHECK_GOTO(rc, cleanup);

        /* validate the value */
        r = lyd_parser_notif_eventtime_validate(node);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);

        /* parser next */
        r = lyxml_ctx_next(xmlctx);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
        if (xmlctx->status != LYXML_ELEM_CLOSE) {
            LOGVAL(ctx, LYVE_DATA, "Unexpected notification \"eventTime\" node children.");
            rc = LY_EVALID;
            lyd_free_tree(node);
            goto cleanup;
        }

        goto node_parsed;
    }

    /* get the schema node */
    r = lydxml_subtree_get_snode(lydctx, parent, prefix, prefix_len, name, name_len, &snode, &ext);
    if (r) {
        rc = r;
        if ((r == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
            /* skip the invalid data */
            if ((r = lydxml_data_skip(xmlctx))) {
                rc = r;
            }
        }
        goto cleanup;
    } else if (!snode && !(lydctx->parse_opts & LYD_PARSE_OPAQ)) {
        LOGVRB("Skipping parsing of unknown node \"%.*s\".", (int)name_len, name);

        /* skip element with children */
        rc = lydxml_data_skip(xmlctx);
        goto cleanup;
    }

    /* create metadata/attributes */
    if (xmlctx->status == LYXML_ATTRIBUTE) {
        if (snode) {
            r = lydxml_metadata(lydctx, snode, &meta);
        } else {
            assert(lydctx->parse_opts & LYD_PARSE_OPAQ);
            r = lydxml_attrs(xmlctx, &attr);
        }
    }
    LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

    assert(xmlctx->status == LYXML_ELEM_CONTENT);
    if (!snode) {
        /* opaque */
        r = lydxml_subtree_opaq(lydctx, parent ? lyd_child(parent) : *first_p, prefix, prefix_len, name, name_len,
                &insert_anchor, &node);
    } else if (snode->nodetype & LYD_NODE_TERM) {
        /* term */
        r = lydxml_subtree_term(lydctx, parent, snode, &node);
    } else if (snode->nodetype & LYD_NODE_INNER) {
        /* inner */
        r = lydxml_subtree_inner(lydctx, snode, ext, &node);
    } else {
        /* any */
        assert(snode->nodetype & LYD_NODE_ANY);
        r = lydxml_subtree_any(lydctx, snode, ext, &node);
    }
    LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

node_parsed:
    if (node && snode) {
        /* add/correct flags */
        r = lyd_parser_set_data_flags(node, &meta, (struct lyd_ctx *)lydctx, ext);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);

        if (!(lydctx->parse_opts & LYD_PARSE_ONLY)) {
            /* store for ext instance node validation, if needed */
            r = lyd_validate_node_ext(node, &lydctx->ext_node);
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        }
    }

    /* parser next */
    assert(xmlctx->status == LYXML_ELEM_CLOSE);
    if (!parse_subtree) {
        r = lyxml_ctx_next(xmlctx);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
    }

    LY_CHECK_GOTO(!node, cleanup);

    /* add metadata/attributes */
    if (snode) {
        lyd_insert_meta(node, meta, 0);
        meta = NULL;
    } else {
        lyd_insert_attr(node, attr);
        attr = NULL;
    }

    /* insert, keep first pointer correct */
    if (insert_anchor) {
        lyd_insert_after(insert_anchor, node);
    } else if (ext) {
        r = lyplg_ext_insert(parent, node);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
    } else {
        lyd_insert_node(parent, first_p, node,
                lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT);
    }
    while (!parent && (*first_p)->prev->next) {
        *first_p = (*first_p)->prev;
    }

    /* rememeber a successfully parsed node */
    if (parsed) {
        ly_set_add(parsed, node, 1, NULL);
    }

cleanup:
    lydctx->parse_opts = orig_parse_opts;
    lyd_free_meta_siblings(meta);
    lyd_free_attr_siblings(ctx, attr);
    return rc;
}